

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool kratos::safe_to_resize_
               (Simulator *sim,Var *var,uint32_t target_size,bool is_signed,
               queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
               *vars)

{
  iterator *piVar1;
  _Elt_pointer ppIVar2;
  IterVar *var_00;
  _func_int **pp_Var3;
  uint32_t target_size_00;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  ulong uVar7;
  optional<long> value;
  optional<long> value_00;
  IterVar *local_68;
  IterVar *t;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> v;
  
  v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>._24_8_
       = ZEXT48(target_size);
  ppIVar2 = (vars->c).
            super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((vars->c).super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppIVar2) {
    iVar5 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
    if ((*(uint *)(CONCAT44(extraout_var,iVar5) + 0x168) & 0xfffffffb) != 0) {
      return true;
    }
    uVar6 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
    return uVar6 <= target_size;
  }
  var_00 = *ppIVar2;
  local_68 = var_00;
  std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::pop_front(&vars->c)
  ;
  value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       1;
  value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)(_Storage<long,_true>)var_00->min_value_;
  Simulator::set_i(sim,&var_00->super_Var,value,false);
  Simulator::eval_expr
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&t,sim,var);
  if (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] != '\x01') {
    return false;
  }
  pp_Var3 = (t->super_Var).super_IRNode._vptr_IRNode;
  if (is_signed) {
    uVar7 = -1L << (v.
                    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_engaged - 1U & 0x3f);
    if ((long)~uVar7 < (long)pp_Var3 || (long)pp_Var3 < (long)uVar7) goto LAB_002086e8;
  }
  else if ((ulong)pp_Var3 >>
           (v.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_engaged & 0x3fU) != 0 &&
           v.
           super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._24_4_ != 0x40) goto LAB_002086e8;
  v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  _M_payload.field2[0x10] = 0;
  operator_delete(t,(long)v.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)t);
  value_00.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = var_00->max_value_ + -1;
  value_00.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = 1;
  Simulator::set_i(sim,&var_00->super_Var,value_00,false);
  Simulator::eval_expr
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&t,sim,var);
  if (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] != '\x01') {
    return false;
  }
  pp_Var3 = (t->super_Var).super_IRNode._vptr_IRNode;
  target_size_00 =
       v.
       super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
       _24_4_;
  if (is_signed) {
    uVar7 = -1L << (v.
                    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_engaged - 1U & 0x3f);
    if ((long)pp_Var3 <= (long)~uVar7 && (long)uVar7 <= (long)pp_Var3) {
LAB_00208683:
      v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] = 0;
      operator_delete(t,(long)v.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)t);
      bVar4 = safe_to_resize_(sim,var,target_size_00,is_signed,vars);
      ppIVar2 = (vars->c).
                super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppIVar2 ==
          (vars->c).
          super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>::
        _M_push_back_aux<kratos::IterVar_const*const&>
                  ((deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>> *)vars,
                   &local_68);
        return bVar4;
      }
      *ppIVar2 = var_00;
      piVar1 = &(vars->c).
                super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
      return bVar4;
    }
  }
  else if ((ulong)pp_Var3 >>
           (v.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_engaged & 0x3fU) == 0 || target_size_00 == 0x40) goto LAB_00208683;
LAB_002086e8:
  v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  _M_payload.field2[0x10] = 0;
  operator_delete(t,(long)v.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)t);
  return false;
}

Assistant:

bool safe_to_resize_(Simulator &sim, const Var *var, uint32_t target_size, bool is_signed,
                     std::queue<const IterVar *> &vars) {
    // notice it's exclusive for max
    if (vars.empty()) {
        const auto *p = var->get_var_root_parent();
        if (p->type() == VarType::Base || p->type() == VarType::PortIO)
            return var->width() <= target_size;
        else
            return true;
    } else {
        // pop one
        auto *t = const_cast<IterVar *>(vars.front());
        vars.pop();
        sim.set_i(t, t->min_value(), false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        // notice it's exclusive for max
        sim.set_i(t, t->max_value() - 1, false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        auto r = safe_to_resize_(sim, var, target_size, is_signed, vars);
        // put it back for backtracking
        vars.push(t);
        return r;
    }
}